

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsInputGetComplex(HelicsInput inp,double *real,double *imag,HelicsError *err)

{
  double *in_RDX;
  double *in_RSI;
  double dVar1;
  complex<double> cval;
  InputObject *inpObj;
  Input *in_stack_ffffffffffffffa0;
  HelicsInput in_stack_ffffffffffffffa8;
  complex<double> local_38;
  InputObject *local_28;
  double *local_18;
  double *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = anon_unknown.dwarf_5d1c2::verifyInput
                       (in_stack_ffffffffffffffa8,(HelicsError *)in_stack_ffffffffffffffa0);
  if (local_28 != (InputObject *)0x0) {
    helics::Input::getValue<std::complex<double>>(in_stack_ffffffffffffffa0);
    if (local_10 != (double *)0x0) {
      dVar1 = std::complex<double>::real_abi_cxx11_(&local_38);
      *local_10 = dVar1;
    }
    if (local_18 != (double *)0x0) {
      dVar1 = std::complex<double>::imag_abi_cxx11_(&local_38);
      *local_18 = dVar1;
    }
  }
  return;
}

Assistant:

void helicsInputGetComplex(HelicsInput inp, double* real, double* imag, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        auto cval = inpObj->inputPtr->getValue<std::complex<double>>();
        if (real != nullptr) {
            *real = cval.real();
        }
        if (imag != nullptr) {
            *imag = cval.imag();
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}